

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O3

bool __thiscall btVoronoiSimplexSolver::updateClosestVectorAndPoints(btVoronoiSimplexSolver *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  byte bVar15;
  bool bVar16;
  undefined4 extraout_EAX;
  int iVar17;
  byte bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  btVector3 local_28;
  
  if (this->m_needsUpdate == false) {
    bVar15 = this->m_cachedValidClosest;
    goto LAB_001816f0;
  }
  (this->m_cachedBC).m_barycentricCoords[0] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
  (this->m_cachedBC).m_degenerate = false;
  bVar15 = *(byte *)&(this->m_cachedBC).m_usedVertices & 0xf0;
  *(byte *)&(this->m_cachedBC).m_usedVertices = bVar15;
  this->m_needsUpdate = false;
  if (4 < (uint)this->m_numVertices) goto switchD_001810cd_caseD_0;
  switch(this->m_numVertices) {
  case 1:
    uVar1 = *(undefined8 *)(this->m_simplexPointsP[0].m_floats + 2);
    uVar2 = *(undefined8 *)this->m_simplexPointsQ[0].m_floats;
    uVar14 = *(undefined8 *)(this->m_simplexPointsQ[0].m_floats + 2);
    *(undefined8 *)(this->m_cachedP1).m_floats = *(undefined8 *)this->m_simplexPointsP[0].m_floats;
    *(undefined8 *)((this->m_cachedP1).m_floats + 2) = uVar1;
    *(undefined8 *)(this->m_cachedP2).m_floats = uVar2;
    *(undefined8 *)((this->m_cachedP2).m_floats + 2) = uVar14;
    uVar1 = *(undefined8 *)(this->m_cachedP1).m_floats;
    uVar2 = *(undefined8 *)(this->m_cachedP2).m_floats;
    auVar4._4_4_ = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
    auVar4._0_4_ = (float)uVar1 - (float)uVar2;
    auVar4._8_4_ = (this->m_cachedP1).m_floats[2] - (this->m_cachedP2).m_floats[2];
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar4;
    (this->m_cachedBC).m_degenerate = false;
    (this->m_cachedBC).m_barycentricCoords[0] = 1.0;
    (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    this->m_cachedValidClosest = true;
LAB_001815e6:
    bVar15 = 1;
    break;
  case 2:
    fVar33 = this->m_simplexVectorW[0].m_floats[0];
    fVar24 = this->m_simplexVectorW[0].m_floats[1];
    fVar20 = 0.0;
    fVar21 = this->m_simplexVectorW[0].m_floats[2];
    fVar30 = this->m_simplexVectorW[1].m_floats[0] - fVar33;
    fVar32 = this->m_simplexVectorW[1].m_floats[1] - fVar24;
    fVar23 = this->m_simplexVectorW[1].m_floats[2] - fVar21;
    fVar33 = (0.0 - fVar21) * fVar23 + (0.0 - fVar33) * fVar30 + (0.0 - fVar24) * fVar32;
    bVar18 = 1;
    if (0.0 < fVar33) {
      fVar20 = fVar23 * fVar23 + fVar30 * fVar30 + fVar32 * fVar32;
      if (fVar20 <= fVar33) {
        fVar20 = 1.0;
        bVar18 = 2;
      }
      else {
        fVar20 = fVar33 / fVar20;
        bVar18 = 3;
      }
    }
    *(byte *)&(this->m_cachedBC).m_usedVertices = bVar15 | bVar18;
    (this->m_cachedBC).m_barycentricCoords[0] = 1.0 - fVar20;
    (this->m_cachedBC).m_barycentricCoords[1] = fVar20;
    (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
    (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
    fVar33 = this->m_simplexPointsP[0].m_floats[2];
    uVar1 = *(undefined8 *)this->m_simplexPointsP[1].m_floats;
    uVar2 = *(undefined8 *)this->m_simplexPointsP[0].m_floats;
    fVar23 = (float)uVar2;
    fVar32 = (float)((ulong)uVar2 >> 0x20);
    fVar23 = ((float)uVar1 - fVar23) * fVar20 + fVar23;
    fVar32 = ((float)((ulong)uVar1 >> 0x20) - fVar32) * fVar20 + fVar32;
    fVar33 = (this->m_simplexPointsP[1].m_floats[2] - fVar33) * fVar20 + fVar33;
    auVar10._4_4_ = fVar32;
    auVar10._0_4_ = fVar23;
    auVar10._8_4_ = fVar33;
    auVar10._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar10;
    fVar24 = this->m_simplexPointsQ[0].m_floats[2];
    uVar1 = *(undefined8 *)this->m_simplexPointsQ[1].m_floats;
    uVar2 = *(undefined8 *)this->m_simplexPointsQ[0].m_floats;
    fVar21 = (float)uVar2;
    fVar30 = (float)((ulong)uVar2 >> 0x20);
    fVar21 = ((float)uVar1 - fVar21) * fVar20 + fVar21;
    fVar30 = ((float)((ulong)uVar1 >> 0x20) - fVar30) * fVar20 + fVar30;
    fVar24 = (this->m_simplexPointsQ[1].m_floats[2] - fVar24) * fVar20 + fVar24;
    auVar3._4_4_ = fVar30;
    auVar3._0_4_ = fVar21;
    auVar3._8_4_ = fVar24;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar3;
    auVar6._4_4_ = fVar32 - fVar30;
    auVar6._0_4_ = fVar23 - fVar21;
    auVar6._8_4_ = fVar33 - fVar24;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar6;
    goto LAB_001816c8;
  case 3:
    local_28.m_floats[0] = 0.0;
    local_28.m_floats[1] = 0.0;
    local_28.m_floats[2] = 0.0;
    local_28.m_floats[3] = 0.0;
    closestPtPointTriangle
              (this,&local_28,this->m_simplexVectorW,this->m_simplexVectorW + 1,
               this->m_simplexVectorW + 2,&this->m_cachedBC);
    fVar33 = (this->m_cachedBC).m_barycentricCoords[2];
    fVar30 = this->m_simplexPointsQ[2].m_floats[0];
    fVar24 = this->m_simplexPointsQ[2].m_floats[1];
    uVar1 = *(undefined8 *)(this->m_cachedBC).m_barycentricCoords;
    fVar22 = (float)uVar1;
    fVar27 = (float)((ulong)uVar1 >> 0x20);
    fVar21 = this->m_simplexPointsQ[0].m_floats[1];
    fVar20 = this->m_simplexPointsQ[1].m_floats[1];
    fVar23 = this->m_simplexPointsQ[1].m_floats[0];
    fVar32 = fVar27 * this->m_simplexPointsP[1].m_floats[0] +
             fVar22 * this->m_simplexPointsP[0].m_floats[0] +
             fVar33 * this->m_simplexPointsP[2].m_floats[0];
    fVar25 = this->m_simplexPointsP[1].m_floats[1] * fVar27 +
             this->m_simplexPointsP[0].m_floats[1] * fVar22 +
             this->m_simplexPointsP[2].m_floats[1] * fVar33;
    fVar26 = this->m_simplexPointsQ[2].m_floats[2] * fVar33 +
             fVar27 * this->m_simplexPointsQ[1].m_floats[2] +
             this->m_simplexPointsQ[0].m_floats[2] * fVar22;
    fVar19 = this->m_simplexPointsP[2].m_floats[2] * fVar33 +
             fVar22 * this->m_simplexPointsP[0].m_floats[2] +
             this->m_simplexPointsP[1].m_floats[2] * fVar27;
    auVar9._4_4_ = fVar25;
    auVar9._0_4_ = fVar32;
    auVar9._8_4_ = fVar19;
    auVar9._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar9;
    fVar30 = fVar27 * fVar23 + fVar22 * this->m_simplexPointsQ[0].m_floats[0] + fVar33 * fVar30;
    fVar33 = fVar20 * fVar27 + fVar21 * fVar22 + fVar24 * fVar33;
    auVar12._4_4_ = fVar33;
    auVar12._0_4_ = fVar30;
    auVar12._8_4_ = fVar26;
    auVar12._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar12;
    auVar7._4_4_ = fVar25 - fVar33;
    auVar7._0_4_ = fVar32 - fVar30;
    auVar7._8_4_ = fVar19 - fVar26;
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar7;
LAB_001816c8:
    reduceVertices(this,&(this->m_cachedBC).m_usedVertices);
    auVar5._4_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[1] < 0.0);
    auVar5._0_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[0] < 0.0);
    auVar5._8_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[2] < 0.0);
    auVar5._12_4_ = -(uint)((this->m_cachedBC).m_barycentricCoords[3] < 0.0);
    iVar17 = movmskps(extraout_EAX,auVar5);
    bVar15 = iVar17 == 0;
    this->m_cachedValidClosest = (bool)bVar15;
    break;
  case 4:
    local_28.m_floats[0] = 0.0;
    local_28.m_floats[1] = 0.0;
    local_28.m_floats[2] = 0.0;
    local_28.m_floats[3] = 0.0;
    bVar16 = closestPtPointTetrahedron
                       (this,&local_28,this->m_simplexVectorW,this->m_simplexVectorW + 1,
                        this->m_simplexVectorW + 2,this->m_simplexVectorW + 3,&this->m_cachedBC);
    if (bVar16) {
      fVar33 = (this->m_cachedBC).m_barycentricCoords[2];
      fVar24 = (this->m_cachedBC).m_barycentricCoords[3];
      fVar32 = this->m_simplexPointsQ[2].m_floats[0];
      fVar25 = this->m_simplexPointsQ[3].m_floats[0];
      fVar21 = this->m_simplexPointsQ[2].m_floats[1];
      fVar20 = this->m_simplexPointsQ[3].m_floats[1];
      uVar1 = *(undefined8 *)(this->m_cachedBC).m_barycentricCoords;
      fVar29 = (float)uVar1;
      fVar31 = (float)((ulong)uVar1 >> 0x20);
      fVar30 = this->m_simplexPointsQ[0].m_floats[1];
      fVar23 = this->m_simplexPointsQ[1].m_floats[1];
      fVar26 = this->m_simplexPointsQ[1].m_floats[0];
      fVar27 = fVar31 * this->m_simplexPointsP[1].m_floats[0] +
               fVar29 * this->m_simplexPointsP[0].m_floats[0] +
               fVar33 * this->m_simplexPointsP[2].m_floats[0] +
               fVar24 * this->m_simplexPointsP[3].m_floats[0];
      fVar28 = this->m_simplexPointsP[1].m_floats[1] * fVar31 +
               this->m_simplexPointsP[0].m_floats[1] * fVar29 +
               this->m_simplexPointsP[2].m_floats[1] * fVar33 +
               this->m_simplexPointsP[3].m_floats[1] * fVar24;
      fVar19 = this->m_simplexPointsQ[3].m_floats[2] * fVar24 +
               this->m_simplexPointsQ[2].m_floats[2] * fVar33 +
               fVar31 * this->m_simplexPointsQ[1].m_floats[2] +
               this->m_simplexPointsQ[0].m_floats[2] * fVar29;
      fVar22 = this->m_simplexPointsP[3].m_floats[2] * fVar24 +
               this->m_simplexPointsP[2].m_floats[2] * fVar33 +
               fVar29 * this->m_simplexPointsP[0].m_floats[2] +
               this->m_simplexPointsP[1].m_floats[2] * fVar31;
      auVar8._4_4_ = fVar28;
      auVar8._0_4_ = fVar27;
      auVar8._8_4_ = fVar22;
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedP1).m_floats = auVar8;
      fVar32 = fVar31 * fVar26 + fVar29 * this->m_simplexPointsQ[0].m_floats[0] + fVar33 * fVar32 +
               fVar24 * fVar25;
      fVar33 = fVar23 * fVar31 + fVar30 * fVar29 + fVar21 * fVar33 + fVar20 * fVar24;
      auVar13._4_4_ = fVar33;
      auVar13._0_4_ = fVar32;
      auVar13._8_4_ = fVar19;
      auVar13._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedP2).m_floats = auVar13;
      auVar11._4_4_ = fVar28 - fVar33;
      auVar11._0_4_ = fVar27 - fVar32;
      auVar11._8_4_ = fVar22 - fVar19;
      auVar11._12_4_ = 0;
      *(undefined1 (*) [16])(this->m_cachedV).m_floats = auVar11;
      goto LAB_001816c8;
    }
    if ((this->m_cachedBC).m_degenerate != true) {
      this->m_cachedValidClosest = true;
      (this->m_cachedV).m_floats[0] = 0.0;
      (this->m_cachedV).m_floats[1] = 0.0;
      (this->m_cachedV).m_floats[2] = 0.0;
      (this->m_cachedV).m_floats[3] = 0.0;
      goto LAB_001815e6;
    }
  case 0:
switchD_001810cd_caseD_0:
    this->m_cachedValidClosest = false;
    bVar15 = 0;
  }
LAB_001816f0:
  return (bool)(bVar15 & 1);
}

Assistant:

bool	btVoronoiSimplexSolver::updateClosestVectorAndPoints()
{
	
	if (m_needsUpdate)
	{
		m_cachedBC.reset();

		m_needsUpdate = false;

		switch (numVertices())
		{
		case 0:
				m_cachedValidClosest = false;
				break;
		case 1:
			{
				m_cachedP1 = m_simplexPointsP[0];
				m_cachedP2 = m_simplexPointsQ[0];
				m_cachedV = m_cachedP1-m_cachedP2; //== m_simplexVectorW[0]
				m_cachedBC.reset();
				m_cachedBC.setBarycentricCoordinates(btScalar(1.),btScalar(0.),btScalar(0.),btScalar(0.));
				m_cachedValidClosest = m_cachedBC.isValid();
				break;
			};
		case 2:
			{
			//closest point origin from line segment
					const btVector3& from = m_simplexVectorW[0];
					const btVector3& to = m_simplexVectorW[1];
					btVector3 nearest;

					btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
					btVector3 diff = p - from;
					btVector3 v = to - from;
					btScalar t = v.dot(diff);
					
					if (t > 0) {
						btScalar dotVV = v.dot(v);
						if (t < dotVV) {
							t /= dotVV;
							diff -= t*v;
							m_cachedBC.m_usedVertices.usedVertexA = true;
							m_cachedBC.m_usedVertices.usedVertexB = true;
						} else {
							t = 1;
							diff -= v;
							//reduce to 1 point
							m_cachedBC.m_usedVertices.usedVertexB = true;
						}
					} else
					{
						t = 0;
						//reduce to 1 point
						m_cachedBC.m_usedVertices.usedVertexA = true;
					}
					m_cachedBC.setBarycentricCoordinates(1-t,t);
					nearest = from + t*v;

					m_cachedP1 = m_simplexPointsP[0] + t * (m_simplexPointsP[1] - m_simplexPointsP[0]);
					m_cachedP2 = m_simplexPointsQ[0] + t * (m_simplexPointsQ[1] - m_simplexPointsQ[0]);
					m_cachedV = m_cachedP1 - m_cachedP2;
					
					reduceVertices(m_cachedBC.m_usedVertices);

					m_cachedValidClosest = m_cachedBC.isValid();
					break;
			}
		case 3: 
			{ 
				//closest point origin from triangle 
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.)); 

				const btVector3& a = m_simplexVectorW[0]; 
				const btVector3& b = m_simplexVectorW[1]; 
				const btVector3& c = m_simplexVectorW[2]; 

				closestPtPointTriangle(p,a,b,c,m_cachedBC); 
				m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] + 
				m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] + 
				m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2]; 

				m_cachedV = m_cachedP1-m_cachedP2; 

				reduceVertices (m_cachedBC.m_usedVertices); 
				m_cachedValidClosest = m_cachedBC.isValid(); 

				break; 
			}
		case 4:
			{

				
				btVector3 p (btScalar(0.),btScalar(0.),btScalar(0.));
				
				const btVector3& a = m_simplexVectorW[0];
				const btVector3& b = m_simplexVectorW[1];
				const btVector3& c = m_simplexVectorW[2];
				const btVector3& d = m_simplexVectorW[3];

				bool hasSeperation = closestPtPointTetrahedron(p,a,b,c,d,m_cachedBC);

				if (hasSeperation)
				{

					m_cachedP1 = m_simplexPointsP[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsP[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsP[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsP[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedP2 = m_simplexPointsQ[0] * m_cachedBC.m_barycentricCoords[0] +
						m_simplexPointsQ[1] * m_cachedBC.m_barycentricCoords[1] +
						m_simplexPointsQ[2] * m_cachedBC.m_barycentricCoords[2] +
						m_simplexPointsQ[3] * m_cachedBC.m_barycentricCoords[3];

					m_cachedV = m_cachedP1-m_cachedP2;
					reduceVertices (m_cachedBC.m_usedVertices);
				} else
				{
//					printf("sub distance got penetration\n");

					if (m_cachedBC.m_degenerate)
					{
						m_cachedValidClosest = false;
					} else
					{
						m_cachedValidClosest = true;
						//degenerate case == false, penetration = true + zero
						m_cachedV.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
					}
					break;
				}

				m_cachedValidClosest = m_cachedBC.isValid();

				//closest point origin from tetrahedron
				break;
			}
		default:
			{
				m_cachedValidClosest = false;
			}
		};
	}

	return m_cachedValidClosest;

}